

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O1

Statistics *
deqp::gles2::Performance::anon_unknown_0::calculateStats
          (Statistics *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *samples)

{
  pointer puVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  
  puVar1 = (samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar1;
  lVar4 = lVar3 >> 3;
  dVar6 = 0.0;
  dVar11 = 0.0;
  uVar2 = (uint)lVar4;
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      dVar11 = dVar11 + ((double)CONCAT44(0x45300000,(int)(puVar1[uVar5] >> 0x20)) -
                        1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)puVar1[uVar5]) - 4503599627370496.0);
      uVar5 = uVar5 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar5);
  }
  auVar9._8_4_ = (int)(lVar3 >> 0x23);
  auVar9._0_8_ = lVar4;
  auVar9._12_4_ = 0x45300000;
  dVar7 = (auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,uVar2) - 4503599627370496.0);
  dVar11 = dVar11 / dVar7;
  if (0 < (int)uVar2) {
    dVar6 = 0.0;
    uVar5 = 0;
    do {
      dVar10 = (((double)CONCAT44(0x45300000,(int)(puVar1[uVar5] >> 0x20)) - 1.9342813113834067e+25)
               + ((double)CONCAT44(0x43300000,(int)puVar1[uVar5]) - 4503599627370496.0)) - dVar11;
      dVar6 = dVar6 + dVar10 * dVar10;
      uVar5 = uVar5 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar5);
  }
  dVar6 = dVar6 / dVar7;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  lVar3 = (long)(samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
  lVar4 = lVar3 >> 3;
  auVar8._8_4_ = (int)(lVar3 >> 0x23);
  auVar8._0_8_ = lVar4;
  auVar8._12_4_ = 0x45300000;
  dVar7 = (auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  __return_storage_ptr__->mean = dVar11;
  __return_storage_ptr__->standardDeviation = dVar6;
  __return_storage_ptr__->standardErrorOfMean = dVar6 / dVar7;
  return __return_storage_ptr__;
}

Assistant:

Statistics calculateStats (const vector<deUint64>& samples)
{
	double mean = 0.0;

	for (int i = 0; i < (int)samples.size(); i++)
		mean += (double)samples[i];

	mean /= (double)samples.size();

	double standardDeviation = 0.0;

	for (int i = 0; i < (int)samples.size(); i++)
	{
		double x = (double)samples[i];
		standardDeviation += (x - mean) * (x - mean);
	}

	standardDeviation /= (double)samples.size();
	standardDeviation = std::sqrt(standardDeviation);

	double standardErrorOfMean = standardDeviation / std::sqrt((double)samples.size());

	Statistics stats;

	stats.mean					= mean;
	stats.standardDeviation		= standardDeviation;
	stats.standardErrorOfMean	= standardErrorOfMean;

	return stats;
}